

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *states1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  int iVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  long lVar17;
  float *pfVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int local_c0;
  float *local_b0;
  float *local_a8;
  
  uVar2 = this->kStateCount;
  uVar3 = this->kCategoryCount;
  iVar4 = this->kPatternCount;
  iVar5 = this->kPartialsPaddedStateCount;
  iVar6 = this->kMatrixSize;
  local_c0 = 0;
  lVar21 = (long)(int)(uVar2 + 1);
  local_b0 = matrices2 + 2;
  iVar10 = startPattern * iVar5;
  local_a8 = matrices2;
  for (uVar15 = 0; uVar15 != (~((int)uVar3 >> 0x1f) & uVar3); uVar15 = uVar15 + 1) {
    pfVar14 = partials2 + iVar10;
    pfVar11 = destP + (iVar4 * (int)uVar15 + startPattern) * iVar5;
    for (lVar17 = (long)startPattern; lVar17 < endPattern; lVar17 = lVar17 + 1) {
      iVar7 = states1[lVar17];
      pfVar9 = local_a8;
      lVar12 = (long)local_c0;
      pfVar19 = local_b0;
      for (uVar20 = 0; uVar20 != (~((int)uVar2 >> 0x1f) & uVar2); uVar20 = uVar20 + 1) {
        lVar8 = iVar7 + lVar12;
        auVar22 = ZEXT816(0) << 0x40;
        lVar13 = 0;
        pfVar16 = pfVar14;
        pfVar18 = pfVar9;
        while (auVar23 = auVar22, lVar13 < (int)uVar2 / 4 << 2) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(pfVar19 + lVar13 + -2);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(pfVar14 + lVar13);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(pfVar19 + lVar13);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pfVar14 + lVar13 + 2);
          lVar13 = lVar13 + 4;
          pfVar16 = pfVar16 + 4;
          pfVar18 = pfVar18 + 4;
          auVar22 = vfmadd213ps_fma(auVar25,auVar23,auVar22);
          auVar22 = vfmadd231ps_fma(auVar22,auVar24,auVar26);
        }
        while (lVar13 < (int)uVar2) {
          fVar1 = *pfVar18;
          lVar13 = lVar13 + 1;
          pfVar18 = pfVar18 + 1;
          auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar16));
          pfVar16 = pfVar16 + 1;
        }
        auVar22 = vmovshdup_avx(auVar22);
        lVar12 = lVar12 + lVar21;
        pfVar19 = pfVar19 + lVar21;
        pfVar9 = pfVar9 + lVar21;
        *pfVar11 = matrices1[lVar8] * (auVar22._0_4_ + auVar23._0_4_);
        pfVar11 = pfVar11 + 1;
      }
      pfVar14 = pfVar14 + iVar5;
    }
    local_c0 = local_c0 + iVar6;
    iVar10 = iVar10 + iVar4 * iVar5;
    local_b0 = local_b0 + iVar6;
    local_a8 = local_a8 + iVar6;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}